

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

bool find_files(string *pathname,string *filename,string_array *files,bool recursive)

{
  byte bVar1;
  bool bVar2;
  DIR *__dirp;
  dirent64 *pdVar3;
  ulong uVar4;
  ulong uVar5;
  string_array *files_00;
  bool bVar6;
  pointer __name;
  uint uVar7;
  ulong uVar8;
  string_array paths;
  string filename_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  value_type local_50;
  
  uVar5 = (ulong)recursive;
  __name = (pathname->_M_dataplus)._M_p;
  if ((pathname->_M_string_length != 0) &&
     ((0x2d < (byte)__name[pathname->_M_string_length - 1] - 0x2f ||
      (uVar5 = 0x200000000801,
      (0x200000000801U >> ((ulong)((byte)__name[pathname->_M_string_length - 1] - 0x2f) & 0x3f) & 1)
      == 0)))) {
    std::__cxx11::string::append((char *)pathname);
    __name = (pathname->_M_dataplus)._M_p;
  }
  __dirp = opendir(__name);
  if (__dirp == (DIR *)0x0) {
    bVar6 = false;
  }
  else {
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      pdVar3 = readdir64(__dirp);
      if (pdVar3 == (dirent64 *)0x0) break;
      if (pdVar3->d_name[0] != '.') {
        bVar1 = pdVar3->d_type;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,pdVar3->d_name,(allocator<char> *)&local_70);
        if ((bVar1 & 4) == 0) {
          if ((bVar1 & 8) != 0) {
            std::operator+(&local_70,pathname,&local_50);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)filename
                       ,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_a8,&local_50);
        }
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    closedir(__dirp);
    uVar7 = 0;
    do {
      uVar8 = (ulong)uVar7;
      uVar4 = (long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar6 = uVar4 <= uVar8;
      if (uVar4 <= uVar8) break;
      std::operator+(&local_90,pathname,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8);
      bVar2 = find_files(&local_90,filename,files_00,SUB81(uVar5,0));
      std::__cxx11::string::~string((string *)&local_90);
      uVar7 = uVar7 + 1;
    } while (bVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
  }
  return bVar6;
}

Assistant:

static bool find_files(std::string pathname, const std::string &filename, string_array &files, bool recursive)
{
   if (!pathname.empty())
   {
      char c = pathname[pathname.size() - 1];
      if ((c != ':') && (c != '\\') && (c != '/'))
         pathname += "/";
   }

   DIR *dp = opendir(pathname.c_str());

   if (!dp)
      return false;

   string_array paths;

   for ( ; ; )
   {
      struct dirent *ep = readdir(dp);
      if (!ep)
         break;

      const bool is_directory = (ep->d_type & DT_DIR) != 0;
      const bool is_file =  (ep->d_type & DT_REG) != 0;

      if (ep->d_name[0] == '.')
         continue;

      std::string filename(ep->d_name);

      if (is_directory)
      {
         if (recursive)
            paths.push_back(filename);
      }
      else if (is_file)
         files.push_back(pathname + filename);
   }

   closedir(dp);
   dp = NULL;

   if (recursive)
   {
      for (uint i = 0; i < paths.size(); i++)
      {
         const std::string &path = paths[i];
         if (!find_files(pathname + path, filename, files, true))
            return false;
      }
   }

   return true;
}